

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool __thiscall
testing::internal::ElementsAreMatcherImpl<const_std::array<unsigned_char,_5UL>_&>::MatchAndExplain
          (ElementsAreMatcherImpl<const_std::array<unsigned_char,_5UL>_&> *this,
          array<unsigned_char,_5UL> *container,MatchResultListener *listener)

{
  ostream *poVar1;
  uchar *puVar2;
  pointer pbVar3;
  bool bVar4;
  MatchResultListener *pMVar5;
  pointer pMVar6;
  pointer pMVar7;
  _func_int **pp_Var8;
  unsigned_long uVar9;
  long lVar10;
  long local_218;
  unsigned_long local_210;
  array<unsigned_char,_5UL> *local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  explanations;
  string local_1e8 [32];
  StringMatchResultListener s;
  
  poVar1 = listener->stream_;
  local_208 = container;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&explanations,
           ((long)(this->matchers_).
                  super__Vector_base<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->matchers_).
                 super__Vector_base<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18,(allocator_type *)&s);
  local_218 = 0;
  lVar10 = 0;
  for (uVar9 = 0;
      (local_210 = uVar9, uVar9 != 5 &&
      (pMVar6 = (this->matchers_).
                super__Vector_base<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar9 != ((long)(this->matchers_).
                      super__Vector_base<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar6) / 0x18));
      uVar9 = uVar9 + 1) {
    puVar2 = local_208->_M_elems;
    if (poVar1 == (ostream *)0x0) {
      bVar4 = MatcherBase<const_unsigned_char_&>::Matches
                        ((MatcherBase<const_unsigned_char_&> *)
                         ((long)&(pMVar6->super_MatcherBase<const_unsigned_char_&>).
                                 super_MatcherDescriberInterface._vptr_MatcherDescriberInterface +
                         local_218),puVar2 + uVar9);
    }
    else {
      StringMatchResultListener::StringMatchResultListener(&s);
      bVar4 = MatcherBase<const_unsigned_char_&>::MatchAndExplain
                        ((MatcherBase<const_unsigned_char_&> *)
                         ((long)&(((this->matchers_).
                                   super__Vector_base<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super_MatcherBase<const_unsigned_char_&>).
                                 super_MatcherDescriberInterface._vptr_MatcherDescriberInterface +
                         local_218),puVar2 + uVar9,&s.super_MatchResultListener);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=
                ((string *)
                 ((long)&((explanations.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar10),
                 local_1e8);
      std::__cxx11::string::~string(local_1e8);
      StringMatchResultListener::~StringMatchResultListener(&s);
    }
    if (!bVar4) {
      bVar4 = true;
      goto LAB_0012fe28;
    }
    lVar10 = lVar10 + 0x20;
    local_218 = local_218 + 0x18;
  }
  bVar4 = false;
LAB_0012fe28:
  pMVar6 = (this->matchers_).
           super__Vector_base<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar7 = (this->matchers_).
           super__Vector_base<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((long)pMVar7 - (long)pMVar6) / 0x18 == 5) {
    if (!bVar4) {
      bVar4 = true;
      if (poVar1 != (ostream *)0x0) {
        bVar4 = false;
        pp_Var8 = (_func_int **)0x0;
        while (pbVar3 = explanations.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
              s.super_MatchResultListener._vptr_MatchResultListener = pp_Var8,
              pp_Var8 != (_func_int **)(((long)pMVar7 - (long)pMVar6) / 0x18)) {
          if (explanations.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)pp_Var8]._M_string_length != 0) {
            if (bVar4) {
              MatchResultListener::operator<<(listener,(char (*) [7])",\nand ");
            }
            pMVar5 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
            pMVar5 = MatchResultListener::operator<<(pMVar5,(unsigned_long *)&s);
            pMVar5 = MatchResultListener::operator<<(pMVar5,(char (*) [11])" matches, ");
            MatchResultListener::operator<<(pMVar5,pbVar3 + (long)pp_Var8);
            pMVar6 = (this->matchers_).
                     super__Vector_base<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pMVar7 = (this->matchers_).
                     super__Vector_base<testing::Matcher<const_unsigned_char_&>,_std::allocator<testing::Matcher<const_unsigned_char_&>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            bVar4 = true;
          }
          pp_Var8 = (_func_int **)((long)s.super_MatchResultListener._vptr_MatchResultListener + 1);
        }
        bVar4 = true;
      }
      goto LAB_0012ff01;
    }
    if (poVar1 != (ostream *)0x0) {
      pMVar5 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
      pMVar5 = MatchResultListener::operator<<(pMVar5,&local_210);
      MatchResultListener::operator<<(pMVar5,(char (*) [15])" doesn\'t match");
      PrintIfNotEmpty(explanations.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + local_210,listener->stream_);
    }
  }
  else if (uVar9 + 5 != uVar9 && poVar1 != (ostream *)0x0) {
    pMVar5 = MatchResultListener::operator<<(listener,(char (*) [11])"which has ");
    Elements((ElementsAreMatcherImpl<const_std::array<unsigned_char,_5UL>_&> *)&s,5);
    MatchResultListener::operator<<(pMVar5,(Message *)&s);
    if (s.super_MatchResultListener._vptr_MatchResultListener != (_func_int **)0x0) {
      (**(code **)(*s.super_MatchResultListener._vptr_MatchResultListener + 8))();
    }
  }
  bVar4 = false;
LAB_0012ff01:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&explanations);
  return bVar4;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    // To work with stream-like "containers", we must only walk
    // through the elements in one pass.

    const bool listener_interested = listener->IsInterested();

    // explanations[i] is the explanation of the element at index i.
    ::std::vector<std::string> explanations(count());
    StlContainerReference stl_container = View::ConstReference(container);
    typename StlContainer::const_iterator it = stl_container.begin();
    size_t exam_pos = 0;
    bool mismatch_found = false;  // Have we found a mismatched element yet?

    // Go through the elements and matchers in pairs, until we reach
    // the end of either the elements or the matchers, or until we find a
    // mismatch.
    for (; it != stl_container.end() && exam_pos != count(); ++it, ++exam_pos) {
      bool match;  // Does the current element match the current matcher?
      if (listener_interested) {
        StringMatchResultListener s;
        match = matchers_[exam_pos].MatchAndExplain(*it, &s);
        explanations[exam_pos] = s.str();
      } else {
        match = matchers_[exam_pos].Matches(*it);
      }

      if (!match) {
        mismatch_found = true;
        break;
      }
    }
    // If mismatch_found is true, 'exam_pos' is the index of the mismatch.

    // Find how many elements the actual container has.  We avoid
    // calling size() s.t. this code works for stream-like "containers"
    // that don't define size().
    size_t actual_count = exam_pos;
    for (; it != stl_container.end(); ++it) {
      ++actual_count;
    }

    if (actual_count != count()) {
      // The element count doesn't match.  If the container is empty,
      // there's no need to explain anything as Google Mock already
      // prints the empty container.  Otherwise we just need to show
      // how many elements there actually are.
      if (listener_interested && (actual_count != 0)) {
        *listener << "which has " << Elements(actual_count);
      }
      return false;
    }

    if (mismatch_found) {
      // The element count matches, but the exam_pos-th element doesn't match.
      if (listener_interested) {
        *listener << "whose element #" << exam_pos << " doesn't match";
        PrintIfNotEmpty(explanations[exam_pos], listener->stream());
      }
      return false;
    }

    // Every element matches its expectation.  We need to explain why
    // (the obvious ones can be skipped).
    if (listener_interested) {
      bool reason_printed = false;
      for (size_t i = 0; i != count(); ++i) {
        const std::string& s = explanations[i];
        if (!s.empty()) {
          if (reason_printed) {
            *listener << ",\nand ";
          }
          *listener << "whose element #" << i << " matches, " << s;
          reason_printed = true;
        }
      }
    }
    return true;
  }